

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-wizard.c
# Opt level: O0

_Bool wiz_create_item_action(menu *m,ui_event *e,wchar_t oid)

{
  bool bVar1;
  _Bool _Var2;
  menu *menu_00;
  cmd_code c;
  ui_event uVar3;
  object_kind *kind;
  artifact *art;
  wchar_t i;
  wchar_t num;
  wchar_t choice [70];
  char local_d8 [8];
  char title [80];
  char buf [80];
  menu *menu;
  ui_event ret;
  wchar_t oid_local;
  ui_event *e_local;
  menu *m_local;
  
  if (e->type == EVT_SELECT) {
    if (oid == L'\xffffd8f1') {
      c = CMD_WIZ_CREATE_ALL_OBJ;
      if (choose_artifact) {
        c = CMD_WIZ_CREATE_ALL_ARTIFACT;
      }
      cmdq_push(c);
      m_local._7_1_ = false;
    }
    else {
      if (choose_artifact) {
        art._4_4_ = 0;
        art._0_4_ = L'\x01';
        while( true ) {
          bVar1 = false;
          if (art._4_4_ < 0x3c) {
            bVar1 = (wchar_t)art < (int)(uint)z_info->a_max;
          }
          if (!bVar1) break;
          if (a_info[(wchar_t)art].tval == oid) {
            (&i)[art._4_4_] = (wchar_t)art;
            art._4_4_ = art._4_4_ + 1;
          }
          art._0_4_ = (wchar_t)art + L'\x01';
        }
      }
      else {
        art._4_4_ = 0;
        art._0_4_ = L'\x01';
        while( true ) {
          bVar1 = false;
          if (art._4_4_ < 0x3c) {
            bVar1 = (wchar_t)art < (int)(uint)z_info->k_max;
          }
          if (!bVar1) break;
          if ((k_info[(wchar_t)art].tval == oid) &&
             (_Var2 = flag_has_dbg(k_info[(wchar_t)art].kind_flags,2,4,"kind->kind_flags",
                                   "KF_INSTA_ART"), !_Var2)) {
            (&i)[art._4_4_] = (wchar_t)art;
            art._4_4_ = art._4_4_ + 1;
          }
          art._0_4_ = (wchar_t)art + L'\x01';
        }
      }
      (&i)[art._4_4_] = L'\xffffd8f1';
      (&i)[art._4_4_ + 1] = oid;
      screen_save();
      clear_from(L'\0');
      menu_00 = menu_new(MN_SKIN_COLUMNS,&wiz_create_item_submenu);
      menu_00->selections = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ";
      object_base_name(title + 0x48,0x50,oid,true);
      if ((choose_artifact & 1U) == 0) {
        strnfmt(local_d8,0x50,"What kind of %s?",title + 0x48);
      }
      else {
        strnfmt(local_d8,0x50,"Which artifact %s? ",title + 0x48);
      }
      menu_00->title = local_d8;
      menu_setpriv(menu_00,art._4_4_ + 1,&i);
      menu_layout(menu_00,&wiz_create_item_area);
      uVar3 = menu_select(menu_00,0,false);
      screen_load();
      mem_free(menu_00);
      menu._0_4_ = uVar3.type;
      m_local._7_1_ = (ui_event_type)menu == EVT_ESCAPE;
    }
  }
  else {
    m_local._7_1_ = true;
  }
  return m_local._7_1_;
}

Assistant:

static bool wiz_create_item_action(struct menu *m, const ui_event *e, int oid)
{
	ui_event ret;
	struct menu *menu;

	char buf[80];
	char title[80];

	int choice[70];
	int num;

	int i;

	if (e->type != EVT_SELECT) return true;

	if (oid == WIZ_CREATE_ALL_MENU_ITEM) {
		cmdq_push((choose_artifact) ? CMD_WIZ_CREATE_ALL_ARTIFACT :
			CMD_WIZ_CREATE_ALL_OBJ);
		return false;
	}

	/* Artifacts */
	if (choose_artifact) {
		/* ...We have to search the whole artifact list. */
		for (num = 0, i = 1; (num < 60) && (i < z_info->a_max); i++) {
			const struct artifact *art = &a_info[i];

			if (art->tval != oid) continue;

			choice[num++] = i;
		}
	} else {
		/* Regular objects */
		for (num = 0, i = 1; (num < 60) && (i < z_info->k_max); i++) {
			struct object_kind *kind = &k_info[i];

			if (kind->tval != oid ||
					kf_has(kind->kind_flags, KF_INSTA_ART))
				continue;

			choice[num++] = i;
		}
	}

	/*
	 * Add a flag for an "All <tval>" item to create all svals of that
	 * tval. The tval is stored (in a super hacky way) beyond the end of
	 * the valid menu items. The menu won't render it, but we can still
	 * get to it without doing a bunch of work.
	 */
	choice[num++] = WIZ_CREATE_ALL_MENU_ITEM;
	choice[num] = oid;

	screen_save();
	clear_from(0);

	menu = menu_new(MN_SKIN_COLUMNS, &wiz_create_item_submenu);
	menu->selections = all_letters;

	object_base_name(buf, sizeof(buf), oid, true);
	if (choose_artifact) {
		strnfmt(title, sizeof(title), "Which artifact %s? ", buf);
	} else {
		strnfmt(title, sizeof(title), "What kind of %s?", buf);
	}
	menu->title = title;

	menu_setpriv(menu, num, choice);
	menu_layout(menu, &wiz_create_item_area);
	ret = menu_select(menu, 0, false);

	screen_load();
	mem_free(menu);

	return (ret.type == EVT_ESCAPE);
}